

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcodes_llvm_builtins.cpp
# Opt level: O0

bool dxil_spv::emit_cmpxchg_instruction(Impl *impl,AtomicCmpXchgInst *instruction)

{
  initializer_list<unsigned_int> __l;
  AtomicCmpXchgInst *pAVar1;
  bool bVar2;
  Id IVar3;
  Type *pTVar4;
  Value *pVVar5;
  Operation *pOVar6;
  Id local_a8;
  Id local_a4;
  initializer_list<unsigned_int> local_a0;
  Operation *local_90;
  Operation *op;
  Id local_80;
  Id local_7c;
  iterator local_78;
  undefined8 local_70;
  vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> local_68;
  Id local_50;
  Id local_4c;
  initializer_list<unsigned_int> local_48;
  Operation *local_38;
  Operation *cmp_op;
  Operation *atomic_op;
  Builder *pBStack_20;
  uint bits;
  Builder *builder;
  AtomicCmpXchgInst *instruction_local;
  Impl *impl_local;
  
  builder = (Builder *)instruction;
  instruction_local = (AtomicCmpXchgInst *)impl;
  pBStack_20 = Converter::Impl::builder(impl);
  pTVar4 = LLVMBC::Value::getType((Value *)builder);
  pTVar4 = LLVMBC::Type::getStructElementType(pTVar4,0);
  atomic_op._4_4_ = LLVMBC::Type::getIntegerBitWidth(pTVar4);
  if (atomic_op._4_4_ == 0x40) {
    spv::Builder::addCapability(pBStack_20,CapabilityInt64Atomics);
  }
  pAVar1 = instruction_local;
  IVar3 = spv::Builder::makeUintType(pBStack_20,atomic_op._4_4_);
  cmp_op = Converter::Impl::allocate((Impl *)pAVar1,OpAtomicCompareExchange,IVar3);
  pAVar1 = instruction_local;
  pVVar5 = LLVMBC::AtomicCmpXchgInst::getPointerOperand((AtomicCmpXchgInst *)builder);
  bVar2 = needs_group_shared_auto_barrier((Impl *)pAVar1,pVVar5);
  pAVar1 = instruction_local;
  pOVar6 = cmp_op;
  if (bVar2) {
    cmp_op->flags = cmp_op->flags | 4;
  }
  pVVar5 = LLVMBC::AtomicCmpXchgInst::getPointerOperand((AtomicCmpXchgInst *)builder);
  IVar3 = Converter::Impl::get_id_for_value((Impl *)pAVar1,pVVar5,0);
  Operation::add_id(pOVar6,IVar3);
  pOVar6 = cmp_op;
  IVar3 = spv::Builder::makeUintConstant(pBStack_20,2,false);
  Operation::add_id(pOVar6,IVar3);
  pOVar6 = cmp_op;
  IVar3 = spv::Builder::makeUintConstant(pBStack_20,0,false);
  Operation::add_id(pOVar6,IVar3);
  pOVar6 = cmp_op;
  IVar3 = spv::Builder::makeUintConstant(pBStack_20,0,false);
  Operation::add_id(pOVar6,IVar3);
  pAVar1 = instruction_local;
  pOVar6 = cmp_op;
  pVVar5 = LLVMBC::AtomicCmpXchgInst::getNewValOperand((AtomicCmpXchgInst *)builder);
  IVar3 = Converter::Impl::get_id_for_value((Impl *)pAVar1,pVVar5,0);
  Operation::add_id(pOVar6,IVar3);
  pAVar1 = instruction_local;
  pOVar6 = cmp_op;
  pVVar5 = LLVMBC::AtomicCmpXchgInst::getCompareOperand((AtomicCmpXchgInst *)builder);
  IVar3 = Converter::Impl::get_id_for_value((Impl *)pAVar1,pVVar5,0);
  Operation::add_id(pOVar6,IVar3);
  Converter::Impl::add((Impl *)instruction_local,cmp_op,false);
  pAVar1 = instruction_local;
  IVar3 = spv::Builder::makeBoolType(pBStack_20);
  pOVar6 = Converter::Impl::allocate((Impl *)pAVar1,OpIEqual,IVar3);
  pAVar1 = instruction_local;
  local_50 = cmp_op->id;
  local_38 = pOVar6;
  pVVar5 = LLVMBC::AtomicCmpXchgInst::getCompareOperand((AtomicCmpXchgInst *)builder);
  local_4c = Converter::Impl::get_id_for_value((Impl *)pAVar1,pVVar5,0);
  local_48._M_array = &local_50;
  local_48._M_len = 2;
  Operation::add_ids(pOVar6,&local_48);
  Converter::Impl::add((Impl *)instruction_local,local_38,false);
  pAVar1 = instruction_local;
  if (*(int *)((long)&instruction_local[0x14].super_Instruction.super_Value.type + 4) == 0) {
    local_80 = spv::Builder::makeUintType(pBStack_20,atomic_op._4_4_);
    local_7c = spv::Builder::makeBoolType(pBStack_20);
    local_78 = &local_80;
    local_70 = 2;
    __l._M_len = 2;
    __l._M_array = local_78;
    std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::vector
              (&local_68,__l,(allocator_type *)((long)&op + 7));
    IVar3 = Converter::Impl::get_struct_type((Impl *)pAVar1,&local_68,0,"CmpXchgResult");
    *(Id *)((long)&instruction_local[0x14].super_Instruction.super_Value.type + 4) = IVar3;
    std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::~vector(&local_68);
  }
  local_90 = Converter::Impl::allocate
                       ((Impl *)instruction_local,OpCompositeConstruct,(Value *)builder,
                        *(Id *)((long)&instruction_local[0x14].super_Instruction.super_Value.type +
                               4));
  local_a8 = cmp_op->id;
  local_a4 = local_38->id;
  local_a0._M_array = &local_a8;
  local_a0._M_len = 2;
  Operation::add_ids(local_90,&local_a0);
  Converter::Impl::add((Impl *)instruction_local,local_90,false);
  return true;
}

Assistant:

bool emit_cmpxchg_instruction(Converter::Impl &impl, const llvm::AtomicCmpXchgInst *instruction)
{
	auto &builder = impl.builder();

	unsigned bits = instruction->getType()->getStructElementType(0)->getIntegerBitWidth();
	if (bits == 64)
		builder.addCapability(spv::CapabilityInt64Atomics);

	Operation *atomic_op = impl.allocate(spv::OpAtomicCompareExchange, builder.makeUintType(bits));
	if (needs_group_shared_auto_barrier(impl, instruction->getPointerOperand()))
		atomic_op->flags |= Operation::AutoGroupSharedBarrier;

	atomic_op->add_id(impl.get_id_for_value(instruction->getPointerOperand()));

	atomic_op->add_id(builder.makeUintConstant(spv::ScopeWorkgroup));
	atomic_op->add_id(builder.makeUintConstant(0));
	atomic_op->add_id(builder.makeUintConstant(0));
	atomic_op->add_id(impl.get_id_for_value(instruction->getNewValOperand()));
	atomic_op->add_id(impl.get_id_for_value(instruction->getCompareOperand()));

	impl.add(atomic_op);

	Operation *cmp_op = impl.allocate(spv::OpIEqual, builder.makeBoolType());
	cmp_op->add_ids({ atomic_op->id, impl.get_id_for_value(instruction->getCompareOperand()) });
	impl.add(cmp_op);

	if (!impl.cmpxchg_type)
		impl.cmpxchg_type =
		    impl.get_struct_type({ builder.makeUintType(bits), builder.makeBoolType() }, 0, "CmpXchgResult");

	Operation *op = impl.allocate(spv::OpCompositeConstruct, instruction, impl.cmpxchg_type);
	op->add_ids({ atomic_op->id, cmp_op->id });
	impl.add(op);

	return true;
}